

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp.hpp
# Opt level: O1

vector<float,_std::allocator<float>_> *
RGB2HSI(vector<float,_std::allocator<float>_> *__return_storage_ptr__,float r,float g,float b)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  double dVar8;
  float fVar9;
  initializer_list<float> __l;
  initializer_list<float> __l_00;
  vector<float,_std::allocator<float>_> rgb;
  allocator_type local_51;
  float local_50;
  float local_4c;
  float local_48;
  float local_44;
  double local_40;
  vector<float,_std::allocator<float>_> local_38;
  float local_1c;
  float local_18;
  float local_14;
  
  __l._M_len = 3;
  __l._M_array = &local_1c;
  local_50 = r;
  local_4c = g;
  local_48 = b;
  local_1c = r;
  local_18 = g;
  local_14 = b;
  std::vector<float,_std::allocator<float>_>::vector(&local_38,__l,&local_51);
  pfVar1 = local_38.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start + 1;
  pfVar2 = local_38.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  pfVar3 = local_38.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pfVar1 != local_38.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish &&
      local_38.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_38.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    do {
      pfVar2 = pfVar1;
      if (*pfVar3 < *pfVar1 || *pfVar3 == *pfVar1) {
        pfVar2 = pfVar3;
      }
      pfVar1 = pfVar1 + 1;
      pfVar3 = pfVar2;
    } while (pfVar1 != local_38.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish);
  }
  fVar4 = local_50 + local_4c + local_48;
  fVar9 = fVar4 / 3.0;
  fVar5 = 0.0;
  fVar6 = 0.0;
  if (0.0 < fVar9) {
    fVar6 = 1.0 - *pfVar2 / fVar9;
  }
  fVar7 = 0.0;
  if (1e-08 <= fVar6) {
    fVar7 = fVar6;
  }
  if (0.0 < fVar7) {
    fVar5 = local_50 / fVar4 - local_4c / fVar4;
    fVar6 = local_50 / fVar4 - local_48 / fVar4;
    dVar8 = (double)(fVar5 + fVar6) * 0.5;
    fVar5 = fVar5 * fVar5 + (local_4c / fVar4 - local_48 / fVar4) * fVar6;
    local_50 = fVar9;
    local_44 = fVar7;
    if (fVar5 < 0.0) {
      local_40 = dVar8;
      fVar5 = sqrtf(fVar5);
      dVar8 = local_40;
    }
    else {
      fVar5 = SQRT(fVar5);
    }
    dVar8 = acos(dVar8 / (double)fVar5);
    fVar5 = (float)dVar8;
    fVar9 = local_50;
    fVar7 = local_44;
    if (local_4c < local_48) {
      fVar5 = 6.2831855 - fVar5;
    }
  }
  __l_00._M_len = 3;
  __l_00._M_array = &local_1c;
  local_1c = fVar5;
  local_18 = fVar7;
  local_14 = fVar9;
  std::vector<float,_std::allocator<float>_>::vector(__return_storage_ptr__,__l_00,&local_51);
  if (local_38.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (float *)0x0) {
    operator_delete(local_38.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<float> RGB2HSI(float r, float g, float b) {
    auto rgb = std::vector<float>({r, g, b});
    auto min = std::min_element(rgb.begin(), rgb.end());

    float h = 0;
    float s = 0;
    float i = (r + g + b) / 3;

    float rn = r / (r + g + b);
    float gn = g / (r + g + b);
    float bn = b / (r + g + b);

    if (i > 0) s = 1 - (rgb[std::distance(rgb.begin(), min)] / i);
    if (s < 1e-8) s = 0;
    if (s > 0) {
        h = acos((0.5 * ((rn - gn) + (rn - bn))) / (std::sqrt((rn - gn) * (rn - gn) + (rn - bn) * (gn - bn))));
        if (b > g) h = 2 * M_PI - h;
    }
    return {h, s, i};
}